

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int prvTidyEncodeCharToUTF8Bytes(uint c,tmbstr encodebuf,TidyOutputSink *outp,int *count)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int local_4c;
  int ix;
  Bool hasError;
  int bytes;
  byte *buf;
  byte tempbuf [10];
  int *count_local;
  TidyOutputSink *outp_local;
  tmbstr encodebuf_local;
  uint c_local;
  
  tempbuf._2_8_ = count;
  memset((void *)((long)&buf + 6),0,10);
  _hasError = (byte *)((long)&buf + 6);
  ix = 0;
  bVar1 = false;
  if (encodebuf != (tmbstr)0x0) {
    _hasError = (byte *)encodebuf;
  }
  bVar3 = (byte)c;
  if (c < 0x80) {
    *_hasError = bVar3;
    ix = 1;
  }
  else if (c < 0x800) {
    *_hasError = (byte)(c >> 6) | 0xc0;
    _hasError[1] = bVar3 & 0x3f | 0x80;
    ix = 2;
  }
  else if (c < 0x10000) {
    *_hasError = (byte)(c >> 0xc) | 0xe0;
    _hasError[1] = (byte)(c >> 6) & 0x3f | 0x80;
    _hasError[2] = bVar3 & 0x3f | 0x80;
    ix = 3;
    if ((c == 0xfffe) || (c == 0xffff)) {
      bVar1 = true;
    }
  }
  else if (c < 0x200000) {
    *_hasError = (byte)(c >> 0x12) | 0xf0;
    _hasError[1] = (byte)(c >> 0xc) & 0x3f | 0x80;
    _hasError[2] = (byte)(c >> 6) & 0x3f | 0x80;
    _hasError[3] = bVar3 & 0x3f | 0x80;
    ix = 4;
    bVar1 = 0x10ffff < c;
  }
  else {
    bVar2 = (byte)(c >> 0x18);
    if (c < 0x4000000) {
      *_hasError = bVar2 | 0xf8;
      _hasError[1] = (byte)(c >> 0x12) | 0x80;
      _hasError[2] = (byte)(c >> 0xc) & 0x3f | 0x80;
      _hasError[3] = (byte)(c >> 6) & 0x3f | 0x80;
      _hasError[4] = bVar3 & 0x3f | 0x80;
      ix = 5;
    }
    else if (c < 0x80000000) {
      *_hasError = bVar2 >> 6 | 0xfc;
      _hasError[1] = bVar2 & 0x3f | 0x80;
      _hasError[2] = (byte)(c >> 0x12) & 0x3f | 0x80;
      _hasError[3] = (byte)(c >> 0xc) & 0x3f | 0x80;
      _hasError[4] = (byte)(c >> 6) & 0x3f | 0x80;
      _hasError[5] = bVar3 & 0x3f | 0x80;
      ix = 6;
    }
    bVar1 = true;
  }
  if ((!bVar1) && (outp != (TidyOutputSink *)0x0)) {
    for (local_4c = 0; local_4c < ix; local_4c = local_4c + 1) {
      (*outp->putByte)(outp->sinkData,_hasError[local_4c]);
    }
  }
  *(int *)tempbuf._2_8_ = ix;
  if (bVar1) {
    encodebuf_local._4_4_ = -1;
  }
  else {
    encodebuf_local._4_4_ = 0;
  }
  return encodebuf_local._4_4_;
}

Assistant:

int TY_(EncodeCharToUTF8Bytes)( uint c, tmbstr encodebuf,
                                TidyOutputSink* outp, int* count )
{
    byte tempbuf[10] = {0};
    byte* buf = &tempbuf[0];
    int bytes = 0;
    Bool hasError = no;
    
    if ( encodebuf )
        buf = (byte*) encodebuf;
        
    if (c <= 0x7F)  /* 0XXX XXXX one byte */
    {
        buf[0] = (tmbchar) c;
        bytes = 1;
    }
    else if (c <= 0x7FF)  /* 110X XXXX  two bytes */
    {
        buf[0] = (tmbchar) ( 0xC0 | (c >> 6) );
        buf[1] = (tmbchar) ( 0x80 | (c & 0x3F) );
        bytes = 2;
    }
    else if (c <= 0xFFFF)  /* 1110 XXXX  three bytes */
    {
        buf[0] = (tmbchar) (0xE0 | (c >> 12));
        buf[1] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[2] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 3;
        if ( c == kUTF8ByteSwapNotAChar || c == kUTF8NotAChar )
            hasError = yes;
    }
    else if (c <= 0x1FFFFF)  /* 1111 0XXX  four bytes */
    {
        buf[0] = (tmbchar) (0xF0 | (c >> 18));
        buf[1] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[2] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[3] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 4;
        if (c > kMaxUTF8FromUCS4)
            hasError = yes;
    }
    else if (c <= 0x3FFFFFF)  /* 1111 10XX  five bytes */
    {
        buf[0] = (tmbchar) (0xF8 | (c >> 24));
        buf[1] = (tmbchar) (0x80 | (c >> 18));
        buf[2] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[3] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[4] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 5;
        hasError = yes;
    }
    else if (c <= 0x7FFFFFFF)  /* 1111 110X  six bytes */
    {
        buf[0] = (tmbchar) (0xFC | (c >> 30));
        buf[1] = (tmbchar) (0x80 | ((c >> 24) & 0x3F));
        buf[2] = (tmbchar) (0x80 | ((c >> 18) & 0x3F));
        buf[3] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[4] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[5] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 6;
        hasError = yes;
    }
    else
        hasError = yes;
        
    /* don't output invalid UTF-8 byte sequence to a stream */
    if ( !hasError && outp != NULL )
    {
        int ix;
        for ( ix=0; ix < bytes; ++ix )
          outp->putByte( outp->sinkData, buf[ix] );
    }

#if 1 && defined(_DEBUG)
    if ( hasError )
    {
        int i;
        fprintf( stderr, "UTF-8 encoding error for U+%x : ", c );
        for (i = 0; i < bytes; i++)
            fprintf( stderr, "0x%02x ", buf[i] );
        fprintf( stderr, "\n" );
    }
#endif
    
    *count = bytes;
    if (hasError)
        return -1;
    return 0;
}